

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  long lVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  char *__s;
  uint uVar17;
  size_t maxlength;
  int *piVar18;
  double dVar19;
  uint *puVar20;
  double *pdVar21;
  double dVar22;
  uint uVar23;
  byte bVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  byte *pbVar28;
  bool bVar29;
  bool bVar30;
  char *fmt;
  curl_off_t num;
  char work [328];
  va_input input [128];
  outsegment output [128];
  byte local_1a14;
  char *local_19f8;
  ulong local_19f0;
  byte *local_19e8;
  int local_19d4;
  uint local_19c4;
  ulong local_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  uint local_1990 [2];
  byte local_1988 [336];
  int local_1838 [2];
  double local_1830 [255];
  uint local_1038 [2];
  undefined8 local_1030;
  long local_1028 [511];
  
  local_1988[0] = 0;
  local_1988[1] = 0;
  local_1988[2] = 0;
  local_1988[3] = 0;
  local_1988[4] = 0;
  local_1988[5] = 0;
  local_1988[6] = 0;
  local_1988[7] = 0;
  local_1988[8] = 0;
  local_1988[9] = 0;
  local_1988[10] = 0;
  local_1988[0xb] = 0;
  local_1988[0xc] = 0;
  local_1988[0xd] = 0;
  local_1988[0xe] = 0;
  local_1988[0xf] = 0;
  local_19f0 = 0xffffffff;
  uVar14 = 0;
  local_19d4 = 0;
  local_19c0 = 0;
  local_19b8 = (byte *)format;
switchD_00142b9f_caseD_68:
  if (*local_19b8 != 0x25) {
    if (*local_19b8 != 0) goto code_r0x00142ba9;
    if ((long)local_19b8 - (long)format != 0) {
      if (0x7f < (int)uVar14) {
        return 0;
      }
      lVar9 = (long)(int)uVar14;
      uVar14 = uVar14 + 1;
      (&local_1030)[lVar9 * 4] = 0x100000;
      local_1028[lVar9 * 4] = (long)format;
      local_1028[lVar9 * 4 + 1] = (long)local_19b8 - (long)format;
    }
    if (-1 < (int)local_19f0) {
      pdVar10 = local_1830;
      uVar15 = 0;
      do {
        if ((local_1988[uVar15 >> 3 & 0x1fffffff] >> ((uint)uVar15 & 7) & 1) == 0) {
          return 0;
        }
        switch(*(undefined4 *)(pdVar10 + -1)) {
        case 0:
        case 1:
        case 2:
        case 4:
        case 5:
        case 7:
        case 8:
          uVar17 = ap_save->gp_offset;
          if ((ulong)uVar17 < 0x29) {
            pdVar21 = (double *)((ulong)uVar17 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar17 + 8;
          }
          else {
            pdVar21 = (double *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = pdVar21 + 1;
          }
          dVar19 = *pdVar21;
          break;
        case 3:
        case 0xb:
        case 0xc:
          uVar17 = ap_save->gp_offset;
          if ((ulong)uVar17 < 0x29) {
            piVar18 = (int *)((ulong)uVar17 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar17 + 8;
          }
          else {
            piVar18 = (int *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = piVar18 + 2;
          }
          dVar19 = (double)(long)*piVar18;
          break;
        case 6:
          uVar17 = ap_save->gp_offset;
          if ((ulong)uVar17 < 0x29) {
            puVar20 = (uint *)((ulong)uVar17 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar17 + 8;
          }
          else {
            puVar20 = (uint *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = puVar20 + 2;
          }
          dVar19 = (double)(ulong)*puVar20;
          break;
        case 9:
          uVar17 = ap_save->fp_offset;
          if ((ulong)uVar17 < 0xa1) {
            pdVar21 = (double *)((ulong)uVar17 + (long)ap_save->reg_save_area);
            ap_save->fp_offset = uVar17 + 0x10;
          }
          else {
            pdVar21 = (double *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = pdVar21 + 1;
          }
          *pdVar10 = *pdVar21;
        default:
          goto switchD_001430b5_caseD_a;
        }
        *pdVar10 = dVar19;
switchD_001430b5_caseD_a:
        uVar15 = uVar15 + 1;
        pdVar10 = pdVar10 + 2;
      } while ((int)local_19f0 + 1 != uVar15);
    }
    if ((int)uVar14 < 1) {
      return 0;
    }
    local_19f8 = "0123456789abcdefghijklmnopqrstuvwxyz";
    uVar15 = 0;
    iVar5 = 0;
    do {
      lVar9 = local_1028[uVar15 * 4 + 1];
      uVar17 = *(uint *)(&local_1030 + uVar15 * 4);
      iVar6 = iVar5;
      if (lVar9 != 0) {
        lVar1 = local_1028[uVar15 * 4];
        lVar26 = 0;
        do {
          iVar6 = (int)lVar26;
          if (*(uchar *)(lVar1 + lVar26) == '\0') break;
          iVar6 = (*stream)(*(uchar *)(lVar1 + lVar26),userp);
          if (iVar6 != 0) {
            return iVar5 + (int)lVar26;
          }
          lVar26 = lVar26 + 1;
          iVar6 = (int)lVar9;
        } while (lVar9 != lVar26);
        iVar5 = iVar5 + iVar6;
        iVar6 = iVar5;
        if ((uVar17 >> 0x14 & 1) == 0) goto LAB_00143229;
        goto switchD_001432d7_default;
      }
LAB_00143229:
      uVar4 = local_1038[uVar15 * 8];
      if ((uVar17 >> 0xe & 1) == 0) {
        uVar27 = (ulong)uVar4;
      }
      else {
        uVar13 = *(uint *)(local_1830 + (long)(int)uVar4 * 2);
        uVar27 = (ulong)uVar13;
        if ((int)uVar13 < 0) {
          uVar27 = (ulong)-uVar13;
          uVar17 = uVar17 & 0xfffffefb | 4;
        }
      }
      iVar25 = (int)uVar27;
      if ((uVar17 >> 0x10 & 1) == 0) {
        uVar13 = 0xffffffff;
        if ((short)uVar17 < 0) {
          uVar13 = local_1038[uVar15 * 8 + 1];
        }
      }
      else {
        uVar13 = *(uint *)(local_1830 + (long)(int)local_1038[uVar15 * 8 + 1] * 2);
        if ((int)uVar13 < 0) {
          uVar13 = 0xffffffff;
        }
      }
      uVar11 = (ulong)*(uint *)((long)local_1028 + uVar15 * 0x20 + -4);
      uVar23 = uVar17;
      iVar5 = iVar6;
      switch(local_1838[uVar11 * 4]) {
      case 0:
        __s = (char *)local_1830[uVar11 * 2];
        if (__s == (char *)0x0) {
          if (uVar13 != 0xffffffff && (int)uVar13 < 5) {
            __s = "";
LAB_00143a6c:
            sVar12 = 0;
            goto LAB_00143a6f;
          }
          uVar17 = uVar17 & 0xfffffff7;
          iVar7 = iVar25 + -5;
          sVar12 = 5;
          iVar5 = 5;
          bVar29 = true;
          __s = "(nil)";
        }
        else {
          if (uVar13 == 0xffffffff) {
            if (*__s == '\0') goto LAB_00143a6c;
            sVar12 = strlen(__s);
          }
          else {
            sVar12 = (size_t)(int)uVar13;
          }
LAB_00143a6f:
          uVar27 = 0x7fffffff;
          if (sVar12 < 0x7fffffff) {
            uVar27 = sVar12;
          }
          iVar5 = (int)uVar27;
          iVar7 = iVar25 - iVar5;
          bVar29 = true;
          if ((uVar17 & 8) != 0) {
            iVar8 = (*stream)('\"',userp);
            if (iVar8 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
            bVar29 = false;
          }
        }
        if ((uVar17 & 4) == 0) {
          if (iVar7 < 1) {
            iVar7 = iVar7 + -1;
          }
          else {
            iVar25 = iVar25 + iVar6;
            do {
              iVar8 = (*stream)(' ',userp);
              if (iVar8 != 0) {
                return iVar6;
              }
              iVar6 = iVar6 + 1;
              iVar8 = iVar7 + -1;
              bVar30 = 0 < iVar7;
              iVar7 = iVar8;
            } while (iVar8 != 0 && bVar30);
            iVar7 = -1;
            iVar6 = iVar25 - iVar5;
          }
        }
        if (sVar12 != 0) {
          uVar27 = 0;
          do {
            iVar5 = (int)uVar27;
            if (__s[uVar27] == '\0') break;
            iVar5 = (*stream)(__s[uVar27],userp);
            if (iVar5 != 0) {
              return iVar6 + (int)uVar27;
            }
            uVar27 = uVar27 + 1;
            iVar5 = (int)sVar12;
          } while (sVar12 != uVar27);
          iVar6 = iVar6 + iVar5;
        }
        iVar5 = iVar6;
        if (((uVar17 & 4) != 0) && (0 < iVar7)) {
          iVar5 = iVar7 + iVar6;
          iVar7 = iVar7 + 1;
          do {
            iVar25 = (*stream)(' ',userp);
            if (iVar25 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
        }
        if (!bVar29) {
          iVar6 = (*stream)('\"',userp);
          if (iVar6 != 0) {
            return iVar5;
          }
          iVar5 = iVar5 + 1;
        }
        break;
      case 1:
        dVar19 = local_1830[uVar11 * 2];
        if (dVar19 == 0.0) {
          iVar7 = iVar25 + -5;
          if ((uVar17 & 4) != 0) {
            if (iVar25 < 6) {
              iVar7 = iVar25 + -6;
            }
            else {
              iVar5 = iVar7 + iVar6;
              do {
                iVar25 = (*stream)(' ',userp);
                if (iVar25 != 0) {
                  return iVar6;
                }
                iVar6 = iVar6 + 1;
                iVar7 = iVar7 + -1;
              } while (0 < iVar7);
              iVar7 = -1;
              iVar6 = iVar5;
            }
          }
          iVar25 = iVar6 + 5;
          uVar3 = '(';
          lVar9 = 0;
          do {
            iVar5 = (*stream)(uVar3,userp);
            if (iVar5 != 0) {
              return iVar6 + (int)lVar9;
            }
            uVar3 = "(nil)"[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 5);
          iVar5 = iVar25;
          if (((uVar17 & 4) == 0) && (0 < iVar7)) {
            iVar5 = iVar25 + iVar7;
            iVar7 = iVar7 + 1;
            do {
              iVar6 = (*stream)(' ',userp);
              if (iVar6 != 0) {
                return iVar25;
              }
              iVar25 = iVar25 + 1;
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
          }
          break;
        }
        local_19f8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar17 >> 0xc & 1) == 0) {
          local_19f8 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        bVar24 = 1;
        dVar22 = 7.90505033345994e-323;
        bVar2 = 0;
        local_1a14 = 1;
        goto LAB_001435b6;
      case 2:
        if ((uVar17 & 0x40) == 0) {
          if ((uVar17 & 0x20) == 0) {
            if ((uVar17 & 0x10) == 0) {
              *(int *)local_1830[uVar11 * 2] = iVar6;
            }
            else {
              *(short *)local_1830[uVar11 * 2] = (short)iVar6;
            }
          }
          else {
            *(long *)local_1830[uVar11 * 2] = (long)iVar6;
          }
        }
        else {
          *(long *)local_1830[uVar11 * 2] = (long)iVar6;
        }
        break;
      case 3:
      case 4:
      case 5:
        goto switchD_001432d7_caseD_3;
      case 6:
      case 7:
      case 8:
        uVar23 = uVar17 | 0x200;
switchD_001432d7_caseD_3:
        dVar19 = local_1830[uVar11 * 2];
        if ((uVar23 >> 0x11 & 1) == 0) {
          local_1a14 = (byte)((uVar17 & 8) >> 3);
          uVar17 = uVar23;
          if ((uVar23 >> 10 & 1) == 0) {
            if ((uVar23 >> 0xb & 1) != 0) {
              local_19f8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
              if ((uVar23 >> 0xc & 1) == 0) {
                local_19f8 = "0123456789abcdefghijklmnopqrstuvwxyz";
              }
              bVar24 = 1;
              dVar22 = 7.90505033345994e-323;
              bVar2 = 0;
              goto LAB_001435b6;
            }
            dVar22 = (double)-(long)dVar19;
            if (0 < (long)dVar19) {
              dVar22 = dVar19;
            }
            bVar29 = (uVar23 >> 9 & 1) == 0;
            if (!bVar29) {
              dVar22 = dVar19;
            }
            if (uVar13 == 0xffffffff) {
              uVar13 = 1;
            }
            uVar27 = 0x144;
            if (dVar22 != 0.0) {
              do {
                local_1988[uVar27] = SUB81(dVar22,0) + (char)((ulong)dVar22 / 10) * -10 | 0x30;
                uVar27 = uVar27 - 1;
                bVar30 = 9 < (ulong)dVar22;
                dVar22 = (double)((ulong)dVar22 / 10);
              } while (bVar30);
            }
            bVar29 = bVar29 && (long)dVar19 < 0;
            iVar5 = 0x144 - (int)uVar27;
            iVar25 = iVar25 - iVar5;
            iVar5 = uVar13 - iVar5;
            bVar24 = 0;
LAB_0014363b:
            if ((0 < iVar5) && (iVar25 = iVar25 - iVar5, -1 < (long)uVar27)) {
              uVar11 = (ulong)((uVar13 + (int)uVar27) - 0x145);
              if (uVar27 < uVar11) {
                uVar11 = uVar27;
              }
              memset(local_1988 + (uVar27 - uVar11),0x30,uVar11 + 1);
              uVar27 = uVar27 + ~uVar11;
            }
          }
          else {
            bVar2 = 1;
            dVar22 = 3.95252516672997e-323;
            bVar24 = 0;
LAB_001435b6:
            if (uVar13 == 0xffffffff) {
              uVar13 = 1;
            }
            if (dVar19 == 0.0) {
              uVar27 = 0x144;
            }
            else {
              uVar27 = 0x144;
              do {
                local_1988[uVar27] = local_19f8[(ulong)dVar19 & (long)dVar22 - 1U];
                uVar27 = uVar27 - 1;
                bVar29 = (ulong)dVar22 <= (ulong)dVar19;
                dVar19 = (double)((ulong)dVar19 / (ulong)dVar22);
              } while (bVar29);
            }
            iVar5 = 0x144 - (int)uVar27;
            iVar25 = iVar25 - iVar5;
            iVar5 = uVar13 - iVar5;
            bVar29 = false;
            if (((bVar2 & local_1a14) != 1) || (0 < iVar5)) goto LAB_0014363b;
            local_1988[uVar27] = 0x30;
            uVar27 = uVar27 - 1;
            iVar25 = iVar25 + -1;
            bVar29 = false;
          }
          iVar5 = iVar25 + -2;
          if ((local_1a14 & bVar24) == 0) {
            iVar5 = iVar25;
          }
          uVar4 = (uint)(byte)((uVar17 & 3) != 0 | bVar29);
          iVar25 = iVar5 - uVar4;
          if ((uVar17 & 0x104) == 0) {
            if (iVar25 < 1) {
              iVar25 = iVar25 + -1;
            }
            else {
              iVar5 = iVar5 + iVar6;
              do {
                iVar7 = (*stream)(' ',userp);
                if (iVar7 != 0) {
                  return iVar6;
                }
                iVar6 = iVar6 + 1;
                iVar7 = iVar25 + -1;
                bVar30 = 0 < iVar25;
                iVar25 = iVar7;
              } while (iVar7 != 0 && bVar30);
              iVar25 = -1;
              iVar6 = iVar5 - uVar4;
            }
          }
          if (bVar29 == false) {
            if ((uVar17 & 2) != 0) {
              uVar3 = '+';
              goto LAB_001438a0;
            }
            if ((uVar17 & 1) != 0) {
              uVar3 = ' ';
              goto LAB_001438a0;
            }
          }
          else {
            uVar3 = '-';
LAB_001438a0:
            iVar5 = (*stream)(uVar3,userp);
            if (iVar5 != 0) {
              return iVar6;
            }
            iVar6 = iVar6 + 1;
          }
          if ((local_1a14 & bVar24) != 0) {
            iVar5 = (*stream)('0',userp);
            if (iVar5 != 0) {
              return iVar6;
            }
            if ((uVar17 >> 0xc & 1) == 0) {
              uVar3 = 'x';
            }
            else {
              uVar3 = 'X';
            }
            iVar5 = (*stream)(uVar3,userp);
            if (iVar5 != 0) {
              return iVar6 + 1;
            }
            iVar6 = iVar6 + 2;
          }
          if ((uVar17 & 0x104) == 0x100) {
            if (iVar25 < 1) {
              iVar25 = iVar25 + -1;
            }
            else {
              iVar5 = iVar6 + iVar25;
              do {
                iVar7 = (*stream)('0',userp);
                if (iVar7 != 0) {
                  return iVar6;
                }
                iVar6 = iVar6 + 1;
                iVar7 = iVar25 + -1;
                bVar29 = 0 < iVar25;
                iVar25 = iVar7;
              } while (iVar7 != 0 && bVar29);
              iVar25 = -1;
              iVar6 = iVar5;
            }
          }
          iVar7 = iVar6;
          if ((long)uVar27 < 0x144) {
            iVar7 = (iVar6 - (int)uVar27) + 0x144;
            do {
              iVar5 = (*stream)(local_1988[uVar27 + 1],userp);
              if (iVar5 != 0) {
                return iVar6;
              }
              uVar27 = uVar27 + 1;
              iVar6 = iVar6 + 1;
            } while (uVar27 != 0x144);
          }
          iVar5 = iVar7;
          if (((uVar17 & 4) != 0) && (0 < iVar25)) {
            iVar5 = iVar25 + iVar7;
            iVar25 = iVar25 + 1;
            do {
              iVar6 = (*stream)(' ',userp);
              if (iVar6 != 0) {
                return iVar7;
              }
              iVar7 = iVar7 + 1;
              iVar25 = iVar25 + -1;
            } while (1 < iVar25);
          }
        }
        else {
          iVar7 = iVar25;
          if (((uVar23 & 4) == 0) && (iVar7 = iVar25 + -1, 1 < iVar25)) {
            iVar5 = iVar7 + iVar6;
            do {
              iVar25 = (*stream)(' ',userp);
              if (iVar25 != 0) {
                return iVar6;
              }
              iVar6 = iVar6 + 1;
              uVar17 = (int)uVar27 - 1;
              uVar27 = (ulong)uVar17;
            } while (1 < (int)uVar17);
            iVar7 = 0;
            iVar6 = iVar5;
          }
          iVar5 = (*stream)(SUB81(dVar19,0),userp);
          if (iVar5 != 0) {
            return iVar6;
          }
          iVar25 = iVar6 + 1;
          iVar5 = iVar25;
          if (((uVar23 & 4) != 0) && (1 < iVar7)) {
            iVar5 = iVar6 + iVar7;
            iVar7 = iVar7 + 1;
            do {
              iVar6 = (*stream)(' ',userp);
              if (iVar6 != 0) {
                return iVar25;
              }
              iVar25 = iVar25 + 1;
              iVar7 = iVar7 + -1;
            } while (2 < iVar7);
          }
        }
        break;
      case 9:
        local_19a8 = 0;
        uStack_19a0 = 0;
        local_19b8 = (byte *)0x25;
        uStack_19b0 = 0;
        sVar12 = strlen((char *)&local_19b8);
        uVar16 = (ulong)uVar4;
        if ((uVar17 >> 0xd & 1) == 0) {
          uVar16 = uVar27;
        }
        uVar4 = (uint)uVar16;
        if ((short)uVar17 < 0) {
          uVar13 = local_1038[uVar15 * 8 + 1];
        }
        pbVar28 = (byte *)((long)&local_19b8 + 1);
        if ((uVar17 & 4) != 0) {
          local_19b8._0_2_ = CONCAT11(0x2d,(char)local_19b8);
          pbVar28 = (byte *)((long)&local_19b8 + 2);
        }
        if ((uVar17 & 2) != 0) {
          *pbVar28 = 0x2b;
          pbVar28 = pbVar28 + 1;
        }
        if ((uVar17 & 1) != 0) {
          *pbVar28 = 0x20;
          pbVar28 = pbVar28 + 1;
        }
        if ((uVar17 & 8) != 0) {
          *pbVar28 = 0x23;
          pbVar28 = pbVar28 + 1;
        }
        maxlength = 0x20 - sVar12;
        *pbVar28 = 0;
        if (-1 < (int)uVar4) {
          if (0x144 < uVar4) {
            uVar16 = 0x145;
          }
          uVar4 = (uint)uVar16;
          iVar5 = curl_msnprintf((char *)pbVar28,maxlength,"%d",uVar16);
          pbVar28 = pbVar28 + iVar5;
          maxlength = maxlength - (long)iVar5;
        }
        if (-1 < (int)uVar13) {
          dVar19 = local_1830[uVar11 * 2];
          if (0x145 < uVar13) {
            uVar13 = 0x144;
          }
          iVar5 = 0x145 - uVar4;
          if ((int)uVar4 < (int)uVar13) {
            iVar5 = 0x145;
          }
          if ((int)uVar4 < 1) {
            iVar5 = 0x145;
          }
          for (; 10.0 <= dVar19; dVar19 = dVar19 / 10.0) {
            iVar5 = iVar5 + -1;
          }
          uVar4 = iVar5 - 1;
          if ((int)uVar13 <= iVar5) {
            uVar4 = uVar13;
          }
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          iVar5 = curl_msnprintf((char *)pbVar28,maxlength,".%d",(ulong)uVar4);
          pbVar28 = pbVar28 + iVar5;
        }
        if ((uVar17 & 0x20) != 0) {
          *pbVar28 = 0x6c;
          pbVar28 = pbVar28 + 1;
        }
        if ((uVar17 >> 0x12 & 1) == 0) {
          bVar2 = 0x66;
          if ((uVar17 >> 0x13 & 1) != 0) {
            bVar2 = ((uVar17 >> 0xc & 1) == 0) << 5 | 0x47;
          }
        }
        else {
          bVar2 = ((uVar17 >> 0xc & 1) == 0) << 5 | 0x45;
        }
        *pbVar28 = bVar2;
        pbVar28[1] = 0;
        snprintf((char *)local_1988,0x146,(char *)&local_19b8,SUB84(local_1830[uVar11 * 2],0));
        pbVar28 = local_1988;
        bVar2 = local_1988[0];
        while (pbVar28 = pbVar28 + 1, iVar5 = iVar6, bVar2 != 0) {
          iVar5 = (*stream)(bVar2,userp);
          if (iVar5 != 0) {
            return iVar6;
          }
          iVar6 = iVar6 + 1;
          bVar2 = *pbVar28;
        }
      }
switchD_001432d7_default:
      uVar15 = uVar15 + 1;
      if (uVar15 == uVar14) {
        return iVar5;
      }
    } while( true );
  }
  local_19e8 = local_19b8 + 1;
  if (local_19b8[1] == 0x25) {
    if (local_19e8 + ~(ulong)format != (byte *)0x0) {
      if (0x7f < (int)uVar14) {
        return 0;
      }
      lVar9 = (long)(int)uVar14;
      uVar14 = uVar14 + 1;
      (&local_1030)[lVar9 * 4] = 0x100000;
      local_1028[lVar9 * 4] = (long)format;
      local_1028[lVar9 * 4 + 1] = (long)(local_19e8 + ~(ulong)format);
    }
    local_19b8 = local_19b8 + 2;
    format = (char *)local_19e8;
    goto switchD_00142b9f_caseD_68;
  }
  local_19f8 = (char *)0x0;
  local_19b8 = local_19e8;
  if (local_19d4 == 1) {
LAB_0014298b:
    local_19c4 = 0xffffffff;
    bVar29 = false;
    local_19d4 = 1;
  }
  else {
    local_19c4 = dollarstring((char *)local_19e8,(char **)&local_19b8);
    if ((int)local_19c4 < 0) {
      if (local_19d4 == 2) {
        return 0;
      }
      goto LAB_0014298b;
    }
    local_19d4 = 2;
    bVar29 = true;
  }
  uVar15 = 0;
  uVar17 = 0;
LAB_001429a0:
  while( true ) {
    uVar4 = (uint)uVar15;
    pbVar28 = local_19b8 + 1;
    bVar2 = *local_19b8;
    if (bVar2 < 0x4c) break;
    if (bVar2 < 0x6c) {
      if (bVar2 == 0x4c) {
        uVar17 = uVar17 | 0x80;
        local_19b8 = pbVar28;
      }
      else if (bVar2 == 0x4f) {
LAB_00142afb:
        uVar17 = uVar17 | 0x20;
        local_19b8 = pbVar28;
      }
      else {
        if (bVar2 != 0x68) goto switchD_001429c9_caseD_21;
        uVar17 = uVar17 | 0x10;
        local_19b8 = pbVar28;
      }
    }
    else {
      if (bVar2 == 0x6c) {
        if ((uVar17 & 0x20) != 0) goto LAB_00142b03;
        goto LAB_00142afb;
      }
      if (bVar2 != 0x71) {
        if (bVar2 == 0x7a) goto LAB_00142afb;
        goto switchD_001429c9_caseD_21;
      }
LAB_00142b03:
      uVar17 = uVar17 | 0x40;
      local_19b8 = pbVar28;
    }
  }
  switch(bVar2) {
  case 0x20:
    uVar17 = uVar17 | 1;
    local_19b8 = pbVar28;
    goto LAB_001429a0;
  case 0x23:
    uVar17 = uVar17 | 8;
    local_19b8 = pbVar28;
    goto LAB_001429a0;
  case 0x2a:
    uVar17 = uVar17 | 0x4000;
    uVar15 = 0xffffffff;
    local_19b8 = pbVar28;
    if (bVar29) {
      uVar4 = dollarstring((char *)pbVar28,(char **)&local_19b8);
      uVar15 = (ulong)uVar4;
      if ((int)uVar4 < 0) {
        return 0;
      }
    }
    goto LAB_001429a0;
  case 0x2b:
    uVar17 = uVar17 | 2;
    local_19b8 = pbVar28;
    goto LAB_001429a0;
  case 0x2d:
    uVar17 = uVar17 & 0xfffffefb | 4;
    local_19b8 = pbVar28;
    goto LAB_001429a0;
  case 0x2e:
    bVar2 = *pbVar28;
    if (bVar2 == 0x2a) {
      uVar17 = uVar17 | 0x10000;
      local_19b8 = local_19b8 + 2;
      if (bVar29) {
        uVar4 = dollarstring((char *)local_19b8,(char **)&local_19b8);
        local_19f8 = (char *)(ulong)uVar4;
        if ((int)uVar4 < 0) {
          return 0;
        }
      }
      else {
        local_19f8 = (char *)0xffffffff;
      }
    }
    else {
      if (bVar2 == 0x2d) {
        pbVar28 = local_19b8 + 2;
      }
      local_19b8 = pbVar28;
      iVar5 = Curl_str_number((char **)&local_19b8,(curl_off_t *)local_1990,0x7fffffff);
      uVar4 = -local_1990[0];
      if (bVar2 != 0x2d) {
        uVar4 = local_1990[0];
      }
      local_19f8 = (char *)(ulong)uVar4;
      if (iVar5 != 0) {
        return 0;
      }
      uVar17 = uVar17 | 0x8000;
    }
    if ((~uVar17 & 0x18000) == 0) {
      return 0;
    }
    goto LAB_001429a0;
  case 0x30:
    uVar17 = uVar17 | (~uVar17 & 4) << 6;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    uVar17 = uVar17 | 0x2000;
    iVar5 = Curl_str_number((char **)&local_19b8,(curl_off_t *)local_1990,0x7fffffff);
    uVar15 = (ulong)local_1990[0];
    if (iVar5 != 0) {
      return 0;
    }
    goto LAB_001429a0;
  }
switchD_001429c9_caseD_21:
  bVar2 = *local_19b8;
  if (bVar2 < 0x58) {
    if (bVar2 == 0x45) {
      local_19e8 = local_19e8 + ~(ulong)format;
      uVar17 = uVar17 | 0x41000;
      goto LAB_00142cf7;
    }
    if (bVar2 != 0x47) {
      if (bVar2 == 0x53) {
        uVar17 = uVar17 | 8;
        goto LAB_00142dbe;
      }
      goto switchD_00142b9f_caseD_68;
    }
    local_19e8 = local_19e8 + ~(ulong)format;
    uVar17 = uVar17 | 0x81000;
LAB_00142cf7:
    iVar5 = 9;
  }
  else {
    switch(bVar2) {
    case 99:
      local_19e8 = local_19e8 + ~(ulong)format;
      uVar17 = uVar17 | 0x20000;
      iVar5 = 3;
      break;
    case 100:
    case 0x69:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 5;
      if ((uVar17 & 0x40) == 0) {
        iVar5 = 4 - (uint)((uVar17 & 0x20) == 0);
      }
      break;
    case 0x65:
      local_19e8 = local_19e8 + ~(ulong)format;
      uVar17 = uVar17 | 0x40000;
      goto LAB_00142cf7;
    case 0x66:
      local_19e8 = local_19e8 + ~(ulong)format;
      goto LAB_00142cf7;
    case 0x67:
      local_19e8 = local_19e8 + ~(ulong)format;
      uVar17 = uVar17 | 0x80000;
      goto LAB_00142cf7;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
      goto switchD_00142b9f_caseD_68;
    case 0x6e:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 2;
      break;
    case 0x6f:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 7 - (uint)((uVar17 & 0x20) == 0);
      if ((uVar17 & 0x40) != 0) {
        iVar5 = 8;
      }
      uVar17 = uVar17 | 0x600;
      break;
    case 0x70:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 1;
      break;
    case 0x73:
LAB_00142dbe:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 0;
      break;
    case 0x75:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 7 - (uint)((uVar17 & 0x20) == 0);
      if ((uVar17 & 0x40) != 0) {
        iVar5 = 8;
      }
      uVar17 = uVar17 | 0x200;
      break;
    case 0x78:
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 7 - (uint)((uVar17 & 0x20) == 0);
      if ((uVar17 & 0x40) != 0) {
        iVar5 = 8;
      }
      uVar17 = uVar17 | 0xa00;
      break;
    default:
      if (bVar2 != 0x58) goto switchD_00142b9f_caseD_68;
      local_19e8 = local_19e8 + ~(ulong)format;
      iVar5 = 7 - (uint)((uVar17 & 0x20) == 0);
      if ((uVar17 & 0x40) != 0) {
        iVar5 = 8;
      }
      uVar17 = uVar17 | 0x1a00;
    }
  }
  if ((uVar17 >> 0xe & 1) != 0) {
    if ((int)uVar4 < 0) {
      uVar15 = local_19c0;
      local_19c0 = (ulong)((int)local_19c0 + 1);
    }
    else if ((local_1988[uVar15 >> 3] >> (uVar4 & 7) & 1) != 0) {
      return 0;
    }
    uVar4 = (uint)uVar15;
    if (0x7f < (int)uVar4) {
      return 0;
    }
    bVar29 = (int)local_19f0 < (int)uVar4;
    if (bVar29) {
      local_19f0 = uVar15;
    }
    local_1838[(long)(int)uVar4 * 4] = 0xb;
    uVar13 = uVar4 + 7;
    if (-1 < (int)uVar4) {
      uVar13 = uVar4;
    }
    local_1988[(int)uVar13 >> 3] = local_1988[(int)uVar13 >> 3] | (byte)(1 << ((byte)uVar15 & 7));
  }
  if ((uVar17 >> 0x10 & 1) != 0) {
    if ((int)(uint)local_19f8 < 0) {
      local_19f8 = (char *)local_19c0;
      local_19c0._0_4_ = (uint)local_19c0 + 1;
    }
    else if ((local_1988[(ulong)local_19f8 >> 3] >> ((uint)local_19f8 & 7) & 1) != 0) {
      return 0;
    }
    if (0x7f < (int)(uint)local_19f8) {
      return 0;
    }
    if ((int)local_19f0 < (int)(uint)local_19f8) {
      local_19f0 = (ulong)local_19f8;
    }
    local_1838[(long)(int)(uint)local_19f8 * 4] = 0xc;
    uVar13 = (uint)local_19f8 + 7;
    if (-1 < (int)(uint)local_19f8) {
      uVar13 = (uint)local_19f8;
    }
    local_1988[(int)uVar13 >> 3] =
         local_1988[(int)uVar13 >> 3] | (byte)(1 << ((byte)local_19f8 & 7));
  }
  uVar13 = local_19c4;
  if ((int)local_19c4 < 0) {
    uVar13 = (uint)local_19c0;
  }
  if (0x7f < (int)uVar13) {
    return 0;
  }
  uVar23 = uVar13 + 7;
  if (-1 < (int)uVar13) {
    uVar23 = uVar13;
  }
  local_1988[(int)uVar23 >> 3] = local_1988[(int)uVar23 >> 3] | (byte)(1 << ((byte)uVar13 & 7));
  local_1838[(long)(int)uVar13 * 4] = iVar5;
  if (0x7f < (int)uVar14) {
    return 0;
  }
  local_19c0 = (ulong)((uint)local_19c0 - ((int)local_19c4 >> 0x1f));
  lVar9 = (long)(int)uVar14;
  uVar14 = uVar14 + 1;
  if ((int)local_19f0 < (int)uVar13) {
    local_19f0 = (ulong)uVar13;
  }
  *(uint *)((long)local_1028 + lVar9 * 0x20 + -4) = uVar13;
  *(uint *)(&local_1030 + lVar9 * 4) = uVar17;
  local_1038[lVar9 * 8] = uVar4;
  local_1038[lVar9 * 8 + 1] = (uint)local_19f8;
  local_1028[lVar9 * 4] = (long)format;
  local_1028[lVar9 * 4 + 1] = (long)local_19e8;
  local_19b8 = pbVar28;
  format = (char *)pbVar28;
  goto switchD_00142b9f_caseD_68;
code_r0x00142ba9:
  local_19b8 = local_19b8 + 1;
  goto switchD_00142b9f_caseD_68;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE + 2];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[BUFFSIZE - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      const char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= BUFFSIZE)
          width = BUFFSIZE - 1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        int maxprec = BUFFSIZE - 1;
        double val = iptr->val.dnum;
        if(prec > maxprec)
          prec = maxprec - 1;
        if(width > 0 && prec <= width)
          maxprec -= width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > maxprec)
          prec = maxprec - 1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      /* !checksrc! disable LONGLINE */
      /* NOLINTNEXTLINE(clang-analyzer-security.insecureAPI.DeprecatedOrUnsafeBufferHandling) */
      (snprintf)(work, BUFFSIZE, formatbuf, iptr->val.dnum);
#ifdef _WIN32
      /* Old versions of the Windows CRT do not terminate the snprintf output
         buffer if it reaches the max size so we do that here. */
      work[BUFFSIZE - 1] = 0;
#endif
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) < BUFFSIZE);
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}